

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeNVT.cpp
# Opt level: O0

RealType __thiscall OpenMD::FluctuatingChargeNVT::calcConservedQuantity(FluctuatingChargeNVT *this)

{
  int iVar1;
  long in_RDI;
  double dVar2;
  pair<double,_double> pVar3;
  RealType thermostat_potential;
  RealType thermostat_kinetic;
  RealType fkBT;
  RealType integralOfChidt;
  RealType chi;
  pair<double,_double> thermostat;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_8;
  
  if ((*(byte *)(in_RDI + 0x28) & 1) == 0) {
    local_8 = 0.0;
  }
  else {
    pVar3 = Snapshot::getElectronicThermostat(*(Snapshot **)(in_RDI + 0x78));
    local_20 = pVar3.first;
    local_18 = pVar3.second;
    iVar1 = SimInfo::getNFluctuatingCharges(*(SimInfo **)(in_RDI + 0x18));
    dVar2 = (double)iVar1 * 8.31451e-07 * *(double *)(in_RDI + 0x50);
    local_8 = (dVar2 * *(double *)(in_RDI + 0x58) * *(double *)(in_RDI + 0x58) * local_20 * local_20
              ) / 0.0008368 + (dVar2 * local_18) / 0.0004184;
  }
  return local_8;
}

Assistant:

RealType FluctuatingChargeNVT::calcConservedQuantity() {
    if (!hasFlucQ_) return 0.0;
    pair<RealType, RealType> thermostat = snap->getElectronicThermostat();
    RealType chi                        = thermostat.first;
    RealType integralOfChidt            = thermostat.second;
    RealType fkBT =
        info_->getNFluctuatingCharges() * Constants::kB * targetTemp_;

    RealType thermostat_kinetic = fkBT * tauThermostat_ * tauThermostat_ * chi *
                                  chi / (2.0 * Constants::energyConvert);

    RealType thermostat_potential =
        fkBT * integralOfChidt / Constants::energyConvert;

    return thermostat_kinetic + thermostat_potential;
  }